

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O3

final_range_t *
tchecker::ta::final_edges
          (final_range_t *__return_storage_ptr__,system_t *system,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  final_iterator_t it;
  flat_integer_variables_valuations_range_t fStack_288;
  final_range_t local_230;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  local_1b0;
  
  syncprod::final_edges(&local_230,&system->super_system_t,labels);
  flat_integer_variables_valuations_range
            (&fStack_288,
             &(system->super_system_t).super_system_t.super_intvars_t._integer_variables.
              super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._flattened_variables);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t(&local_1b0,&local_230,&fStack_288);
  cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>
  ::~cartesian_iterator_t(&fStack_288._begin);
  syncprod::final_iterator_t::~final_iterator_t(&local_230._begin);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t(&__return_storage_ptr__->_begin,&local_1b0);
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t(&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

tchecker::ta::final_range_t final_edges(tchecker::ta::system_t const & system, boost::dynamic_bitset<> const & labels)
{
  tchecker::ta::final_iterator_t it{tchecker::syncprod::final_edges(system.as_syncprod_system(), labels),
                                    tchecker::flat_integer_variables_valuations_range(system.integer_variables().flattened())};
  return tchecker::make_range(it, tchecker::past_the_end_iterator);
}